

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

void __thiscall cmsys::RegularExpression::RegularExpression(RegularExpression *this)

{
  RegularExpression *this_local;
  
  RegularExpressionMatch::RegularExpressionMatch(&this->regmatch);
  this->regstart = '\0';
  this->reganch = '\0';
  this->regmust = (char *)0x0;
  this->program = (char *)0x0;
  this->progsize = 0;
  return;
}

Assistant:

inline RegularExpression::RegularExpression()
  : regstart{}
  , reganch{}
  , regmust{}
  , program{ nullptr }
  , progsize{}
{
}